

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O3

bool __thiscall
ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth
          (ON_ArithmeticCalculatorImplementation *this)

{
  bool bVar1;
  ARITHMETIC_OP AVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->m_error_condition != '\0') {
    return false;
  }
  uVar3 = this->m_expression_depth;
  if (uVar3 < 2) {
    this->m_op_stack_pointer = 0;
    this->m_expression_depth = 0;
    this->m_op_stack[0].m_x = 0.0;
    this->m_op_stack[0].m_op = op_unset;
    this->m_op_stack[0].m_level = 0;
    goto LAB_00419c9a;
  }
  uVar4 = (ulong)this->m_op_stack_pointer;
  if (uVar3 == this->m_op_stack[uVar4].m_level) {
    this->m_bPendingImpliedMultiplication = '\0';
    AVar2 = ArithmeticOperationIsPending(this);
    if (AVar2 - op_add < 2) {
      bVar1 = EvaluatePendingArithmeticOperation(this);
      if (!bVar1) {
        return false;
      }
      uVar4 = (ulong)this->m_op_stack_pointer;
      uVar3 = this->m_expression_depth;
    }
    else if (AVar2 != op_unset) goto LAB_00419c8b;
    if ((uVar3 == this->m_op_stack[uVar4].m_level) && (this->m_op_stack[uVar4].m_op == op_number)) {
      this->m_expression_depth = uVar3 - 1;
      this->m_op_stack[uVar4].m_level = uVar3 - 1;
      AVar2 = ArithmeticOperationIsPending(this);
      if (((AVar2 & ~op_number) == op_mult) &&
         (bVar1 = EvaluatePendingArithmeticOperation(this), !bVar1)) {
        return false;
      }
      this->m_bPendingImpliedMultiplication = this->m_bImpliedMultiplicationEnabled;
      return true;
    }
    if (this->m_error_condition != '\0') {
      return false;
    }
  }
LAB_00419c8b:
  this->m_op_stack_pointer = 0;
  this->m_expression_depth = 0;
  this->m_op_stack[0].m_x = 0.0;
  this->m_op_stack[0].m_op = op_unset;
  this->m_op_stack[0].m_level = 0;
LAB_00419c9a:
  this->m_bPendingImpliedMultiplication = '\0';
  this->m_bPendingUnaryPlus = '\0';
  this->m_bPendingUnaryMinus = '\0';
  this->m_bUnsetValue = '\0';
  this->m_error_condition = '\x02';
  return false;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth()
{
  if (m_error_condition)
    return false;

  if ( m_expression_depth <= 1 )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_bPendingImpliedMultiplication = false;

  const unsigned int pending_op = ArithmeticOperationIsPending();
  switch(pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_add:
  case ON_ArithmeticCalculatorImplementation::op_sub:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;

  case ON_ArithmeticCalculatorImplementation::op_unset:
    // empty case
    break;

  default:
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
    break;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  if ( ON_ArithmeticCalculatorImplementation::op_number != m_op_stack[m_op_stack_pointer].m_op )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_expression_depth--;
  m_op_stack[m_op_stack_pointer].m_level = m_expression_depth;

  const unsigned int previous_pending_op = ArithmeticOperationIsPending();
  switch(previous_pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_mult:
  case ON_ArithmeticCalculatorImplementation::op_div:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;
  }

  m_bPendingImpliedMultiplication = m_bImpliedMultiplicationEnabled;

  return true;
}